

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void read_global_motion(AV1_COMMON *cm,aom_read_bit_buffer *rb)

{
  int iVar1;
  WarpedMotionParams *in_RSI;
  WarpedMotionParams *in_RDI;
  int good_params;
  WarpedMotionParams *ref_params;
  int frame;
  int iStackY_2c;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  for (iVar2 = 1; iVar2 < 8; iVar2 = iVar2 + 1) {
    if (*(long *)(in_RDI[6].wmmat + 2) == 0) {
      iStackY_2c = 0;
    }
    else {
      iStackY_2c = (int)((ulong)(*(long *)(in_RDI[6].wmmat + 2) + 0x114 + (long)iVar2 * 0x24) >>
                        0x20);
    }
    iVar1 = read_global_motion_params
                      (in_RDI,in_RSI,
                       (aom_read_bit_buffer *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),iStackY_2c);
    if (iVar1 == 0) {
      *(undefined1 *)((long)in_RDI[(long)iVar2 + 0x2a7].wmmat + 9) = 1;
    }
  }
  memcpy((void *)(*(long *)(in_RDI[6].wmmat + 4) + 0x114),in_RDI[0x2a6].wmmat + 3,0x120);
  return;
}

Assistant:

static inline void read_global_motion(AV1_COMMON *cm,
                                      struct aom_read_bit_buffer *rb) {
  for (int frame = LAST_FRAME; frame <= ALTREF_FRAME; ++frame) {
    const WarpedMotionParams *ref_params =
        cm->prev_frame ? &cm->prev_frame->global_motion[frame]
                       : &default_warp_params;
    int good_params =
        read_global_motion_params(&cm->global_motion[frame], ref_params, rb,
                                  cm->features.allow_high_precision_mv);
    if (!good_params) {
#if WARPED_MOTION_DEBUG
      printf("Warning: unexpected global motion shear params from aomenc\n");
#endif
      cm->global_motion[frame].invalid = 1;
    }

    // TODO(sarahparker, debargha): The logic in the commented out code below
    // does not work currently and causes mismatches when resize is on. Fix it
    // before turning the optimization back on.
    /*
    YV12_BUFFER_CONFIG *ref_buf = get_ref_frame(cm, frame);
    if (cm->width == ref_buf->y_crop_width &&
        cm->height == ref_buf->y_crop_height) {
      read_global_motion_params(&cm->global_motion[frame],
                                &cm->prev_frame->global_motion[frame], rb,
                                cm->features.allow_high_precision_mv);
    } else {
      cm->global_motion[frame] = default_warp_params;
    }
    */
    /*
    printf("Dec Ref %d [%d/%d]: %d %d %d %d\n",
           frame, cm->current_frame.frame_number, cm->show_frame,
           cm->global_motion[frame].wmmat[0],
           cm->global_motion[frame].wmmat[1],
           cm->global_motion[frame].wmmat[2],
           cm->global_motion[frame].wmmat[3]);
           */
  }
  memcpy(cm->cur_frame->global_motion, cm->global_motion,
         REF_FRAMES * sizeof(WarpedMotionParams));
}